

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
KillBotsIRCCommand::trigger
          (KillBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  char *pcVar2;
  const_iterator __begin1;
  undefined8 *puVar3;
  undefined8 *local_40;
  undefined8 *local_38;
  long local_30;
  
  pcVar2 = channel._M_str;
  lVar1 = Jupiter::IRC::Client::getChannel
                    (source,channel._M_len,pcVar2,pcVar2,nick._M_len,nick._M_str);
  if (lVar1 != 0) {
    RenX::getCore();
    Jupiter::IRC::Client::Channel::getType();
    RenX::Core::getServers((int)&local_40);
    puVar3 = local_40;
    if (local_40 == local_38) {
      Jupiter::IRC::Client::sendMessage
                (source,channel._M_len,pcVar2,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    else {
      do {
        RenX::Server::send(*puVar3,8,"killbots");
        RenX::Server::sendMessage(*puVar3,0x2b,"All bots have been removed from the server.");
        puVar3 = puVar3 + 1;
      } while (puVar3 != local_38);
    }
    if (local_40 != (undefined8 *)0x0) {
      operator_delete(local_40,local_30 - (long)local_40);
    }
  }
  return;
}

Assistant:

void KillBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	for (const auto& server : servers) {
		server->send("killbots"sv);
		server->sendMessage("All bots have been removed from the server."sv);
	}
}